

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O0

void __thiscall RingBuffer<QuickPacket>::RingBuffer(RingBuffer<QuickPacket> *this,uint16_t capacity)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  QuickPacket *pQVar5;
  ulong uVar6;
  QuickPacket *local_58;
  uint16_t capacity_local;
  RingBuffer<QuickPacket> *this_local;
  
  this->_capacity = (uint)capacity;
  this->_read_index = 0;
  this->_write_index = 0;
  this->_buffer = (QuickPacket *)0x0;
  if (capacity < 3 || capacity == 0xffff) {
    __assert_fail("capacity > 2 && capacity < MAX_PACKET_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/ring_buffer.h"
                  ,0xb,"RingBuffer<QuickPacket>::RingBuffer(uint16_t) [T = QuickPacket]");
  }
  uVar2 = (ulong)this->_capacity;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x28),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pQVar5 = (QuickPacket *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_58 = pQVar5;
    do {
      QuickPacket::QuickPacket(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != pQVar5 + uVar2);
  }
  this->_buffer = pQVar5;
  std::__atomic_base<unsigned_short>::operator=
            (&(this->_packet_count).super___atomic_base<unsigned_short>,0);
  return;
}

Assistant:

explicit RingBuffer(uint16_t capacity) :
	_capacity(capacity){
		assert(capacity > 2 && capacity < MAX_PACKET_COUNT);
		_buffer = new T[_capacity];
		_packet_count = 0;
	}